

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O0

lws_vhost * lws_create_vhost(lws_context *context,lws_context_creation_info *info)

{
  char *__src;
  char **ppcVar1;
  int iVar2;
  lws_vhost *vhost;
  size_t sVar3;
  char *pcVar4;
  lws_protocols *__dest;
  lws_dll2_owner *plVar5;
  char **ppcVar6;
  lws_role_ops *ar;
  lws_role_ops **ppxx;
  int n;
  char *p;
  char buf [96];
  int sec_pcol_count;
  int abs_pcol_count;
  int fx;
  int f;
  int m;
  lws_protocols *lwsp;
  lws_protocols *pcols;
  lws_http_mount *mounts;
  lws_vhost **vh1;
  lws_vhost *vh;
  lws_context_creation_info *info_local;
  lws_context *context_local;
  
  vhost = (lws_vhost *)lws_zalloc(0x2b8,"create vhost");
  mounts = (lws_http_mount *)&context->vhost_list;
  lwsp = info->protocols;
  if (vhost != (lws_vhost *)0x0) {
    if ((lwsp == (lws_protocols *)0x0) && (info->pprotocols == (lws_protocols **)0x0)) {
      lwsp = protocols_dummy;
    }
    vhost->context = context;
    if (info->vhost_name == (char *)0x0) {
      vhost->name = "default";
    }
    else {
      vhost->name = info->vhost_name;
    }
    *(char **)((long)&vhost->http + 0x88) = info->error_document_404;
    if ((info->options & 0x400000) == 0x400000) {
      _lws_log(8,"%s set to only support RAW\n",vhost->name);
    }
    vhost->iface = info->iface;
    vhost->bind_iface = info->bind_iface;
    if (info->retry_and_idle_policy == (lws_retry_bo_t *)0x0) {
      vhost->retry_policy = &context->default_retry;
    }
    else {
      vhost->retry_policy = info->retry_and_idle_policy;
    }
    if (lwsp == (lws_protocols *)0x0) {
      vhost->count_protocols = 0;
      while (info->pprotocols[vhost->count_protocols] != (lws_protocols *)0x0) {
        vhost->count_protocols = vhost->count_protocols + 1;
      }
    }
    else {
      vhost->count_protocols = 0;
      while (lwsp[vhost->count_protocols].callback != (lws_callback_function *)0x0) {
        vhost->count_protocols = vhost->count_protocols + 1;
      }
    }
    vhost->options = info->options;
    vhost->pvo = info->pvo;
    vhost->headers = info->headers;
    vhost->user = info->user;
    vhost->finalize = info->finalize;
    vhost->finalize_arg = info->finalize_arg;
    vhost->listen_accept_role = info->listen_accept_role;
    vhost->listen_accept_protocol = info->listen_accept_protocol;
    vhost->unix_socket_perms = info->unix_socket_perms;
    ar = (lws_role_ops *)available_roles;
    do {
      if (ar->name == (char *)0x0) {
        if (info->keepalive_timeout == 0) {
          vhost->keepalive_timeout = 5;
        }
        else {
          vhost->keepalive_timeout = info->keepalive_timeout;
        }
        if (info->timeout_secs_ah_idle == 0) {
          vhost->timeout_secs_ah_idle = 10;
        }
        else {
          vhost->timeout_secs_ah_idle = info->timeout_secs_ah_idle;
        }
        *(char **)((long)&vhost->tls + 0x10) = info->alpn;
        *(int *)((long)&vhost->tls + 0x60) = info->ssl_info_event_mask;
        if (info->ecdh_curve != (char *)0x0) {
          lws_strncpy((char *)((long)&vhost->tls + 0x30),info->ecdh_curve,0x10);
        }
        ppxx._4_4_ = 0;
        if (info->ssl_cert_filepath != (char *)0x0) {
          sVar3 = strlen(info->ssl_cert_filepath);
          ppxx._4_4_ = (int)sVar3 + 1;
        }
        if (info->ssl_private_key_filepath != (char *)0x0) {
          sVar3 = strlen(info->ssl_private_key_filepath);
          ppxx._4_4_ = (int)sVar3 + 1 + ppxx._4_4_;
        }
        if (ppxx._4_4_ != 0) {
          pcVar4 = (char *)lws_realloc((void *)0x0,(long)ppxx._4_4_,"vh paths");
          *(char **)((long)&vhost->tls + 0x20) = pcVar4;
          *(char **)((long)&vhost->tls + 0x28) = pcVar4;
          if (info->ssl_cert_filepath != (char *)0x0) {
            sVar3 = strlen(info->ssl_cert_filepath);
            iVar2 = (int)sVar3 + 1;
            memcpy(*(char **)((long)&vhost->tls + 0x20),info->ssl_cert_filepath,(long)iVar2);
            *(char **)((long)&vhost->tls + 0x28) = *(char **)((long)&vhost->tls + 0x28) + iVar2;
          }
          if (info->ssl_private_key_filepath != (char *)0x0) {
            pcVar4 = *(char **)((long)&vhost->tls + 0x28);
            __src = info->ssl_private_key_filepath;
            sVar3 = strlen(info->ssl_private_key_filepath);
            memcpy(pcVar4,__src,sVar3 + 1);
          }
        }
        __dest = (lws_protocols *)
                 lws_zalloc((long)(vhost->count_protocols + (int)context->plugin_protocol_count + 1)
                            * 0x38,"vhost-specific plugin table");
        if (__dest == (lws_protocols *)0x0) {
          _lws_log(1,"OOM\n");
          return (lws_vhost *)0x0;
        }
        iVar2 = vhost->count_protocols;
        if (lwsp == (lws_protocols *)0x0) {
          for (ppxx._4_4_ = 0; ppxx._4_4_ < iVar2; ppxx._4_4_ = ppxx._4_4_ + 1) {
            memcpy(__dest + ppxx._4_4_,info->pprotocols[ppxx._4_4_],0x38);
          }
        }
        else {
          memcpy(__dest,lwsp,(long)iVar2 * 0x38);
        }
        vhost->protocols = __dest;
        vhost->field_0x2b4 = vhost->field_0x2b4 | 1;
        plVar5 = (lws_dll2_owner *)lws_zalloc((long)vhost->count_protocols * 0x18,"same vh list");
        vhost->same_vh_protocol_owner = plVar5;
        *(lws_http_mount **)((long)&vhost->http + 0x80) = info->mounts;
        if (info->port == -2) {
          strcpy((char *)&p,"(no listener)");
        }
        else if (info->port == -1) {
          strcpy((char *)&p,"(serving disabled)");
        }
        else {
          lws_snprintf((char *)&p,0x60,"port %u",(ulong)(uint)info->port);
        }
        _lws_log(8,"Creating Vhost \'%s\' %s, %d protocols, IPv6 %s\n",vhost->name,&p,
                 (ulong)(uint)vhost->count_protocols,"off");
        for (pcols = (lws_protocols *)info->mounts; pcols != (lws_protocols *)0x0;
            pcols = (lws_protocols *)pcols->name) {
          _lws_log(8,"   mounting %s%s to %s\n",
                   mount_protocols[*(byte *)((long)&pcols[1].per_session_data_size + 5)],
                   pcols->per_session_data_size,pcols->callback);
        }
        vhost->listen_port = info->port;
        *(uint *)((long)&vhost->http + 0x90) = 0;
        (vhost->http).http_proxy_address[0] = 0;
        if (info->http_proxy_address == (char *)0x0) {
          pcVar4 = getenv("http_proxy");
          if (pcVar4 != (char *)0x0) {
            lws_strncpy((char *)&p,pcVar4,0x60);
            lws_set_proxy(vhost,(char *)&p);
          }
        }
        else {
          if (info->http_proxy_port != 0) {
            *(uint *)((long)&vhost->http + 0x90) = info->http_proxy_port;
          }
          lws_set_proxy(vhost,info->http_proxy_address);
        }
        vhost->ka_time = info->ka_time;
        vhost->ka_interval = info->ka_interval;
        vhost->ka_probes = info->ka_probes;
        if ((vhost->options & 0x8000) != 0) {
          _lws_log(4,"   STS enabled\n");
        }
        iVar2 = lws_context_init_server_ssl(info,vhost);
        if (iVar2 == 0) {
          iVar2 = lws_context_init_client_ssl(info,vhost);
          if (iVar2 == 0) {
            iVar2 = _lws_vhost_init_server(info,vhost);
            if (iVar2 < 0) {
              _lws_log(1,"init server failed\n");
            }
            else {
              for (; mounts->mount_next != (lws_http_mount *)0x0;
                  mounts = (lws_http_mount *)&mounts->mount_next[3].def) {
              }
              mounts->mount_next = (lws_http_mount *)vhost;
              if ((*(ushort *)&context->field_0x510 >> 6 & 1) == 0) {
                return vhost;
              }
              iVar2 = lws_protocol_init(context);
              if (iVar2 == 0) {
                return vhost;
              }
              _lws_log(1,"%s: lws_protocol_init failed\n","lws_create_vhost");
            }
          }
          else {
            _lws_log(1,"%s: lws_context_init_client_ssl failed\n","lws_create_vhost");
          }
        }
        else {
          _lws_log(1,"%s: lws_context_init_server_ssl failed\n","lws_create_vhost");
        }
        lws_vhost_destroy(vhost);
        return (lws_vhost *)0x0;
      }
      ppcVar6 = &ar->alpn;
      ppcVar1 = &ar->name;
      ar = (lws_role_ops *)ppcVar6;
    } while ((*(long *)(*ppcVar1 + 0x20) == 0) ||
            (iVar2 = (**(code **)(*ppcVar1 + 0x20))(vhost,info), iVar2 == 0));
  }
  return (lws_vhost *)0x0;
}

Assistant:

struct lws_vhost *
lws_create_vhost(struct lws_context *context,
		 const struct lws_context_creation_info *info)
{
	struct lws_vhost *vh = lws_zalloc(sizeof(*vh), "create vhost"),
			 **vh1 = &context->vhost_list;
	const struct lws_http_mount *mounts;
	const struct lws_protocols *pcols = info->protocols;
#ifdef LWS_WITH_PLUGINS
	struct lws_plugin *plugin = context->plugin_list;
#endif
	struct lws_protocols *lwsp;
	int m, f = !info->pvo, fx = 0, abs_pcol_count = 0, sec_pcol_count = 0;
	char buf[96];
#if ((defined(LWS_CLIENT_HTTP_PROXYING) && defined(LWS_WITH_CLIENT)) \
		|| defined(LWS_WITH_SOCKS5)) && defined(LWS_HAVE_GETENV)
	char *p;
#endif
#if defined(LWS_WITH_SYS_ASYNC_DNS)
	extern struct lws_protocols lws_async_dns_protocol;
#endif
	int n;

	if (!vh)
		return NULL;

#if LWS_MAX_SMP > 1
	pthread_mutex_init(&vh->lock, NULL);
#endif

	if (!pcols && !info->pprotocols)
		pcols = &protocols_dummy[0];

	vh->context = context;
	if (!info->vhost_name)
		vh->name = "default";
	else
		vh->name = info->vhost_name;

#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	vh->http.error_document_404 = info->error_document_404;
#endif

	if (lws_check_opt(info->options, LWS_SERVER_OPTION_ONLY_RAW))
		lwsl_info("%s set to only support RAW\n", vh->name);

	vh->iface = info->iface;
#if !defined(LWS_PLAT_FREERTOS) && !defined(OPTEE_TA) && !defined(WIN32)
	vh->bind_iface = info->bind_iface;
#endif
	/* apply the context default lws_retry */

	if (info->retry_and_idle_policy)
		vh->retry_policy = info->retry_and_idle_policy;
	else
		vh->retry_policy = &context->default_retry;

	/*
	 * let's figure out how many protocols the user is handing us, using the
	 * old or new way depending on what he gave us
	 */

	if (!pcols)
		for (vh->count_protocols = 0;
			info->pprotocols[vh->count_protocols];
			vh->count_protocols++)
			;
	else
		for (vh->count_protocols = 0;
			pcols[vh->count_protocols].callback;
			vh->count_protocols++)
				;

	vh->options = info->options;
	vh->pvo = info->pvo;
	vh->headers = info->headers;
	vh->user = info->user;
	vh->finalize = info->finalize;
	vh->finalize_arg = info->finalize_arg;
	vh->listen_accept_role = info->listen_accept_role;
	vh->listen_accept_protocol = info->listen_accept_protocol;
	vh->unix_socket_perms = info->unix_socket_perms;

	LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar)
		if (ar->init_vhost)
			if (ar->init_vhost(vh, info))
				return NULL;
	LWS_FOR_EVERY_AVAILABLE_ROLE_END;


	if (info->keepalive_timeout)
		vh->keepalive_timeout = info->keepalive_timeout;
	else
		vh->keepalive_timeout = 5;

	if (info->timeout_secs_ah_idle)
		vh->timeout_secs_ah_idle = info->timeout_secs_ah_idle;
	else
		vh->timeout_secs_ah_idle = 10;

#if defined(LWS_WITH_TLS)

	vh->tls.alpn = info->alpn;
	vh->tls.ssl_info_event_mask = info->ssl_info_event_mask;

	if (info->ecdh_curve)
		lws_strncpy(vh->tls.ecdh_curve, info->ecdh_curve,
			    sizeof(vh->tls.ecdh_curve));

	/* carefully allocate and take a copy of cert + key paths if present */
	n = 0;
	if (info->ssl_cert_filepath)
		n += (int)strlen(info->ssl_cert_filepath) + 1;
	if (info->ssl_private_key_filepath)
		n += (int)strlen(info->ssl_private_key_filepath) + 1;

	if (n) {
		vh->tls.key_path = vh->tls.alloc_cert_path =
					lws_malloc(n, "vh paths");
		if (info->ssl_cert_filepath) {
			n = (int)strlen(info->ssl_cert_filepath) + 1;
			memcpy(vh->tls.alloc_cert_path,
			       info->ssl_cert_filepath, n);
			vh->tls.key_path += n;
		}
		if (info->ssl_private_key_filepath)
			memcpy(vh->tls.key_path, info->ssl_private_key_filepath,
			       strlen(info->ssl_private_key_filepath) + 1);
	}
#endif

#if defined(LWS_WITH_HTTP_PROXY) && defined(LWS_ROLE_WS)
	fx = 1;
#endif
#if defined(LWS_WITH_ABSTRACT)
	abs_pcol_count = (int)LWS_ARRAY_SIZE(available_abstract_protocols) - 1;
#endif
#if defined(LWS_WITH_SECURE_STREAMS)
	sec_pcol_count = (int)LWS_ARRAY_SIZE(available_secstream_protocols) - 1;
#endif

	/*
	 * give the vhost a unified list of protocols including:
	 *
	 * - internal, async_dns if enabled (first vhost only)
	 * - internal, abstracted ones
	 * - the ones that came from plugins
	 * - his user protocols
	 */
	lwsp = lws_zalloc(sizeof(struct lws_protocols) *
				(vh->count_protocols +
				   abs_pcol_count + sec_pcol_count +
				   context->plugin_protocol_count +
				   fx + 1),
			  "vhost-specific plugin table");
	if (!lwsp) {
		lwsl_err("OOM\n");
		return NULL;
	}

	/*
	 * 1: user protocols (from pprotocols or protocols)
	 */

	m = vh->count_protocols;
	if (!pcols) {
		for (n = 0; n < m; n++)
			memcpy(&lwsp[n], info->pprotocols[n], sizeof(lwsp[0]));
	} else
		memcpy(lwsp, pcols, sizeof(struct lws_protocols) * m);

	/*
	 * 2: abstract protocols
	 */
#if defined(LWS_WITH_ABSTRACT)
	for (n = 0; n < abs_pcol_count; n++) {
		memcpy(&lwsp[m++], available_abstract_protocols[n],
		       sizeof(*lwsp));
		vh->count_protocols++;
	}
#endif
	/*
	 * 3: async dns protocol (first vhost only)
	 */
#if defined(LWS_WITH_SYS_ASYNC_DNS)
	if (!context->vhost_list) {
		memcpy(&lwsp[m++], &lws_async_dns_protocol,
		       sizeof(struct lws_protocols));
		vh->count_protocols++;
	}
#endif

#if defined(LWS_WITH_SECURE_STREAMS)
	for (n = 0; n < sec_pcol_count; n++) {
		memcpy(&lwsp[m++], available_secstream_protocols[n],
		       sizeof(*lwsp));
		vh->count_protocols++;
	}
#endif

	/*
	 * 3: For compatibility, all protocols enabled on vhost if only
	 * the default vhost exists.  Otherwise only vhosts who ask
	 * for a protocol get it enabled.
	 */

	if (context->options & LWS_SERVER_OPTION_EXPLICIT_VHOSTS)
		f = 0;
	(void)f;
#ifdef LWS_WITH_PLUGINS
	if (plugin) {
		while (plugin) {
			for (n = 0; n < plugin->caps.count_protocols; n++) {
				/*
				 * for compatibility's sake, no pvo implies
				 * allow all protocols
				 */
				if (f || lws_vhost_protocol_options(vh,
				    plugin->caps.protocols[n].name)) {
					memcpy(&lwsp[m],
					       &plugin->caps.protocols[n],
					       sizeof(struct lws_protocols));
					m++;
					vh->count_protocols++;
				}
			}
			plugin = plugin->list;
		}
	}
#endif

#if defined(LWS_WITH_HTTP_PROXY) && defined(LWS_ROLE_WS)
	memcpy(&lwsp[m++], &lws_ws_proxy, sizeof(*lwsp));
	vh->count_protocols++;
#endif

	vh->protocols = lwsp;
	vh->allocated_vhost_protocols = 1;

	vh->same_vh_protocol_owner = (struct lws_dll2_owner *)
			lws_zalloc(sizeof(struct lws_dll2_owner) *
				   vh->count_protocols, "same vh list");
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	vh->http.mount_list = info->mounts;
#endif

#ifdef LWS_WITH_UNIX_SOCK
	if (LWS_UNIX_SOCK_ENABLED(vh)) {
		lwsl_info("Creating Vhost '%s' path \"%s\", %d protocols\n",
				vh->name, vh->iface, vh->count_protocols);
	} else
#endif
	{
		switch(info->port) {
		case CONTEXT_PORT_NO_LISTEN:
			strcpy(buf, "(serving disabled)");
			break;
		case CONTEXT_PORT_NO_LISTEN_SERVER:
			strcpy(buf, "(no listener)");
			break;
		default:
			lws_snprintf(buf, sizeof(buf), "port %u", info->port);
			break;
		}
		lwsl_info("Creating Vhost '%s' %s, %d protocols, IPv6 %s\n",
			    vh->name, buf, vh->count_protocols,
			    LWS_IPV6_ENABLED(vh) ? "on" : "off");
	}
	mounts = info->mounts;
	while (mounts) {
		(void)mount_protocols[0];
		lwsl_info("   mounting %s%s to %s\n",
			  mount_protocols[mounts->origin_protocol],
			  mounts->origin, mounts->mountpoint);

		mounts = mounts->mount_next;
	}

	vh->listen_port = info->port;

#if defined(LWS_WITH_SOCKS5)
	vh->socks_proxy_port = 0;
	vh->socks_proxy_address[0] = '\0';
#endif

#if defined(LWS_WITH_CLIENT) && defined(LWS_CLIENT_HTTP_PROXYING)
	/* either use proxy from info, or try get it from env var */
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	vh->http.http_proxy_port = 0;
	vh->http.http_proxy_address[0] = '\0';
	/* http proxy */
	if (info->http_proxy_address) {
		/* override for backwards compatibility */
		if (info->http_proxy_port)
			vh->http.http_proxy_port = info->http_proxy_port;
		lws_set_proxy(vh, info->http_proxy_address);
	} else
#endif
	{
#ifdef LWS_HAVE_GETENV
#if defined(__COVERITY__)
		p = NULL;
#else
		p = getenv("http_proxy"); /* coverity[tainted_scalar] */
		if (p) {
			lws_strncpy(buf, p, sizeof(buf));
			lws_set_proxy(vh, buf);
		}
#endif
#endif
	}
#endif
#if defined(LWS_WITH_SOCKS5)
	lws_socks5c_ads_server(vh, info);
#endif

	vh->ka_time = info->ka_time;
	vh->ka_interval = info->ka_interval;
	vh->ka_probes = info->ka_probes;

	if (vh->options & LWS_SERVER_OPTION_STS)
		lwsl_notice("   STS enabled\n");

#ifdef LWS_WITH_ACCESS_LOG
	if (info->log_filepath) {
		vh->log_fd = lws_open(info->log_filepath,
				  O_CREAT | O_APPEND | O_RDWR, 0600);
		if (vh->log_fd == (int)LWS_INVALID_FILE) {
			lwsl_err("unable to open log filepath %s\n",
				 info->log_filepath);
			goto bail;
		}
#ifndef WIN32
		if (context->uid != -1)
			if (chown(info->log_filepath, context->uid,
				  context->gid) == -1)
				lwsl_err("unable to chown log file %s\n",
						info->log_filepath);
#endif
	} else
		vh->log_fd = (int)LWS_INVALID_FILE;
#endif
	if (lws_context_init_server_ssl(info, vh)) {
		lwsl_err("%s: lws_context_init_server_ssl failed\n", __func__);
		goto bail1;
	}
	if (lws_context_init_client_ssl(info, vh)) {
		lwsl_err("%s: lws_context_init_client_ssl failed\n", __func__);
		goto bail1;
	}
#if defined(LWS_WITH_SERVER)
	lws_context_lock(context, "create_vhost");
	n = _lws_vhost_init_server(info, vh);
	lws_context_unlock(context);
	if (n < 0) {
		lwsl_err("init server failed\n");
		goto bail1;
	}
#endif
	n = !!context->vhost_list;

	while (1) {
		if (!(*vh1)) {
			*vh1 = vh;
			break;
		}
		vh1 = &(*vh1)->vhost_next;
	};

#if defined(LWS_WITH_SYS_ASYNC_DNS)
	if (!n && lws_async_dns_init(context))
		goto bail1;
#endif

	/* for the case we are adding a vhost much later, after server init */

	if (context->protocol_init_done)
		if (lws_protocol_init(context)) {
			lwsl_err("%s: lws_protocol_init failed\n", __func__);
			goto bail1;
		}

	return vh;

bail1:
	lws_vhost_destroy(vh);

	return NULL;

#ifdef LWS_WITH_ACCESS_LOG
bail:
	lws_free(vh);
#endif

	return NULL;
}